

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeRef * __thiscall ExpressionContext::GetReferenceType(ExpressionContext *this,TypeBase *type)

{
  bool bVar1;
  ExpressionContext *this_00;
  byte local_41;
  ExpressionContext *local_40;
  InplaceStr local_38;
  ExpressionContext *local_28;
  TypeRef *result;
  TypeBase *type_local;
  ExpressionContext *this_local;
  
  result = (TypeRef *)type;
  type_local = (TypeBase *)this;
  bVar1 = isType<TypeArgumentSet>(type);
  local_41 = 0;
  if (!bVar1) {
    bVar1 = isType<TypeMemberSet>(&result->super_TypeBase);
    local_41 = 0;
    if (!bVar1) {
      bVar1 = isType<TypeFunctionSet>(&result->super_TypeBase);
      local_41 = bVar1 ^ 0xff;
    }
  }
  if ((local_41 & 1) == 0) {
    __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x68a,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
  }
  bVar1 = isType<TypeError>(&result->super_TypeBase);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isType<TypeError>(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x68b,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
  }
  if (result != (TypeRef *)this->typeAuto) {
    if ((result->super_TypeBase).refType == (TypeRef *)0x0) {
      this_00 = (ExpressionContext *)get<TypeRef>(this);
      local_38 = GetReferenceTypeName(this,&result->super_TypeBase);
      TypeRef::TypeRef((TypeRef *)this_00,local_38,&result->super_TypeBase);
      (result->super_TypeBase).refType = (TypeRef *)this_00;
      local_40 = this_00;
      local_28 = this_00;
      SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_40);
      this_local = local_28;
    }
    else {
      this_local = (ExpressionContext *)(result->super_TypeBase).refType;
    }
    return (TypeRef *)this_local;
  }
  __assert_fail("type != typeAuto",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x68e,"TypeRef *ExpressionContext::GetReferenceType(TypeBase *)");
}

Assistant:

TypeRef* ExpressionContext::GetReferenceType(TypeBase* type)
{
	// Can't derive from pseudo types
	assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));
	assert(!isType<TypeError>(type));

	// Can't create reference to auto this way
	assert(type != typeAuto);

	if(type->refType)
		return type->refType;

	// Create new type
	TypeRef* result = new (get<TypeRef>()) TypeRef(GetReferenceTypeName(*this, type), type);

	// Save it for future use
	type->refType = result;

	types.push_back(result);

	return result;
}